

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::ConfigureSubDirectory(cmMakefile *this,cmMakefile *mf)

{
  pointer pcVar1;
  pointer ppcVar2;
  bool bVar3;
  PolicyStatus PVar4;
  string *psVar5;
  ostream *poVar6;
  PolicyID id;
  PolicyID id_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string msg_1;
  string currentStartFile;
  string currentStart;
  ostringstream e;
  string local_1f8;
  string local_1d8;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_1b8;
  cmState *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  cmState *local_188;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_180;
  ios_base local_128 [264];
  
  InitializeFromParent(mf,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)local_198,&mf->StateSnapshot);
  psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_198);
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  local_1b8 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_1a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b8,pcVar1,pcVar1 + psVar5->_M_string_length);
  if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
    local_198._0_8_ = (pointer)0x18;
    local_198._8_8_ = "   Entering             ";
    local_188 = local_1b0;
    local_180 = local_1b8;
    views._M_len = 2;
    views._M_array = (iterator)local_198;
    cmCatViews_abi_cxx11_(&local_1d8,views);
    cmSystemTools::Message(&local_1d8,(char *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_1b8,
             (pointer)((long)&(local_1b8->Data).
                              super__Vector_base<cmStateDetail::SnapshotDataType,_std::allocator<cmStateDetail::SnapshotDataType>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (long)&(local_1b0->PropertyDefinitions).Map_._M_t._M_impl.field_0x0));
  std::__cxx11::string::append((char *)&local_1d8);
  bVar3 = cmsys::SystemTools::FileExists(&local_1d8,true);
  if (bVar3) {
    Configure(mf);
    if (this->GlobalGenerator->CMakeInstance->DebugOutput == true) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_198,&this->StateSnapshot);
      psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)local_198);
      local_180 = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)(psVar5->_M_dataplus)._M_p;
      local_188 = (cmState *)psVar5->_M_string_length;
      local_198._0_8_ = (pointer)0x18;
      local_198._8_8_ = "   Returning to         ";
      views_00._M_len = 2;
      views_00._M_array = (iterator)local_198;
      cmCatViews_abi_cxx11_(&local_1f8,views_00);
      cmSystemTools::Message(&local_1f8,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
    }
    goto LAB_0029a927;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"The source directory\n",0x15);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"  ",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,(char *)local_1b8,(long)local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,"does not contain a CMakeLists.txt file.",0x27);
  PVar4 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0014,false);
  if (PVar4 - REQUIRED_IF_USED < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_1f8,(cmPolicies *)0xe,id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
LAB_0029a8a7:
    std::__cxx11::stringbuf::str();
    ppcVar2 = (this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((this->ExecutionStatusStack).
        super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppcVar2) {
      ppcVar2[-1]->NestedError = true;
    }
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,FATAL_ERROR,&local_1f8,&this->Backtrace
                       );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
LAB_0029a8fc:
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
  }
  else if (PVar4 == WARN) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"CMake does not support this case but it used ",0x2d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"to work accidentally and is being allowed for ",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"compatibility.",0xe);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\n",1);
    cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1f8,(cmPolicies *)0xe,id_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,AUTHOR_WARNING,&local_1f8,
                        &this->Backtrace);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) goto LAB_0029a8fc;
  }
  else if (PVar4 == NEW) goto LAB_0029a8a7;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
LAB_0029a927:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if (local_1b8 != (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_1a8) {
    operator_delete(local_1b8,(ulong)((long)&((PositionType *)local_1a8._0_8_)->Tree + 1));
  }
  return;
}

Assistant:

void cmMakefile::ConfigureSubDirectory(cmMakefile* mf)
{
  mf->InitializeFromParent(this);
  std::string currentStart = mf->GetCurrentSourceDirectory();
  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg = cmStrCat("   Entering             ", currentStart);
    cmSystemTools::Message(msg);
  }

  std::string const currentStartFile = currentStart + "/CMakeLists.txt";
  if (!cmSystemTools::FileExists(currentStartFile, true)) {
    // The file is missing.  Check policy CMP0014.
    std::ostringstream e;
    /* clang-format off */
    e << "The source directory\n"
      << "  " << currentStart << "\n"
      << "does not contain a CMakeLists.txt file.";
    /* clang-format on */
    switch (this->GetPolicyStatus(cmPolicies::CMP0014)) {
      case cmPolicies::WARN:
        // Print the warning.
        /* clang-format off */
        e << "\n"
          << "CMake does not support this case but it used "
          << "to work accidentally and is being allowed for "
          << "compatibility."
          << "\n"
          << cmPolicies::GetPolicyWarning(cmPolicies::CMP0014);
        /* clang-format on */
        this->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior does not warn.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << "\n" << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0014);
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior prints the error.
        this->IssueMessage(MessageType::FATAL_ERROR, e.str());
        break;
    }
    return;
  }
  // finally configure the subdir
  mf->Configure();

  if (this->GetCMakeInstance()->GetDebugOutput()) {
    std::string msg =
      cmStrCat("   Returning to         ", this->GetCurrentSourceDirectory());
    cmSystemTools::Message(msg);
  }
}